

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn_live.c
# Opt level: O1

void cmn_live_update(cmn_t *cmn)

{
  int iVar1;
  int iVar2;
  mfcc_t *pmVar3;
  mfcc_t *pmVar4;
  long lVar5;
  long lVar6;
  
  if (0 < cmn->nframe) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn_live.c"
            ,0x78,"Update from < ");
    if (0 < cmn->veclen) {
      lVar6 = 0;
      do {
        err_msg(ERR_INFOCONT,(char *)0x0,0,"%5.2f ",(double)(float)cmn->cmn_mean[lVar6]);
        lVar6 = lVar6 + 1;
      } while (lVar6 < cmn->veclen);
    }
    err_msg(ERR_INFOCONT,(char *)0x0,0,">\n");
    iVar1 = cmn->nframe;
    iVar2 = cmn->veclen;
    lVar6 = (long)iVar2;
    if (0 < lVar6) {
      pmVar3 = cmn->cmn_mean;
      pmVar4 = cmn->sum;
      lVar5 = 0;
      do {
        pmVar3[lVar5] = (mfcc_t)((float)pmVar4[lVar5] / (float)iVar1);
        lVar5 = lVar5 + 1;
      } while (lVar6 != lVar5);
    }
    if (800 < iVar1) {
      if (0 < iVar2) {
        pmVar3 = cmn->sum;
        lVar5 = 0;
        do {
          pmVar3[lVar5] = (mfcc_t)((float)pmVar3[lVar5] * (1.0 / (float)iVar1) * 500.0);
          lVar5 = lVar5 + 1;
        } while (lVar6 != lVar5);
      }
      cmn->nframe = 500;
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn_live.c"
            ,0x8a,"Update to   < ");
    if (0 < cmn->veclen) {
      lVar6 = 0;
      do {
        err_msg(ERR_INFOCONT,(char *)0x0,0,"%5.2f ",(double)(float)cmn->cmn_mean[lVar6]);
        lVar6 = lVar6 + 1;
      } while (lVar6 < cmn->veclen);
    }
    err_msg(ERR_INFOCONT,(char *)0x0,0,">\n");
    return;
  }
  return;
}

Assistant:

void
cmn_live_update(cmn_t *cmn)
{
    mfcc_t sf;
    int32 i;

    if (cmn->nframe <= 0)
        return;

    E_INFO("Update from < ");
    for (i = 0; i < cmn->veclen; i++)
        E_INFOCONT("%5.2f ", MFCC2FLOAT(cmn->cmn_mean[i]));
    E_INFOCONT(">\n");

    /* Update mean buffer */
    sf = FLOAT2MFCC(1.0) / cmn->nframe;
    for (i = 0; i < cmn->veclen; i++)
        cmn->cmn_mean[i] = cmn->sum[i] / cmn->nframe; /* sum[i] * sf; */

    /* Make the accumulation decay exponentially */
    if (cmn->nframe > CMN_WIN_HWM) {
        sf = CMN_WIN * sf;
        for (i = 0; i < cmn->veclen; i++)
            cmn->sum[i] = MFCCMUL(cmn->sum[i], sf);
        cmn->nframe = CMN_WIN;
    }

    E_INFO("Update to   < ");
    for (i = 0; i < cmn->veclen; i++)
        E_INFOCONT("%5.2f ", MFCC2FLOAT(cmn->cmn_mean[i]));
    E_INFOCONT(">\n");
}